

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFFT.hpp
# Opt level: O3

void __thiscall audiofft::OouraFFT::ifft(OouraFFT *this,float *data,float *re,float *im)

{
  double *pdVar1;
  ulong uVar2;
  double *a;
  size_t sVar3;
  pointer pdVar4;
  size_t sVar5;
  long lVar6;
  undefined1 auVar7 [16];
  
  uVar2 = this->_size;
  a = (this->_buffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start;
  if (uVar2 != 0) {
    lVar6 = 0;
    do {
      pdVar1 = (double *)((long)a + lVar6 * 4);
      *pdVar1 = (double)*(float *)((long)re + lVar6);
      pdVar1[1] = -(double)*(float *)((long)im + lVar6);
      lVar6 = lVar6 + 4;
    } while (pdVar1 + 2 != a + uVar2);
  }
  a[1] = (double)*(float *)((long)re + (uVar2 & 0xfffffffffffffffe) * 2);
  rdft(this,(int)uVar2,-1,a,
       (this->_ip).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start,(this->_w).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start);
  sVar3 = this->_size;
  if (sVar3 != 0) {
    pdVar4 = (this->_buffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    auVar7._8_4_ = (int)(sVar3 >> 0x20);
    auVar7._0_8_ = sVar3;
    auVar7._12_4_ = 0x45300000;
    sVar5 = 0;
    do {
      data[sVar5] = (float)(pdVar4[sVar5] *
                           (2.0 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0))));
      sVar5 = sVar5 + 1;
    } while (sVar3 != sVar5);
  }
  return;
}

Assistant:

virtual void ifft(float* data, const float* re, const float* im) override
        {
          // Convert into the format as required by the Ooura FFT
          {
            double* b = _buffer.data();
            double* bEnd = b + _size;
            const float *r = re;
            const float *i = im;
            while (b != bEnd)
            {
              *(b++) = static_cast<double>(*(r++));
              *(b++) = -static_cast<double>(*(i++));
            }
            _buffer[1] = re[_size / 2];
          }

          rdft(static_cast<int>(_size), -1, _buffer.data(), _ip.data(), _w.data());

          // Convert back to split-complex
          detail::ScaleBuffer(data, _buffer.data(), 2.0 / static_cast<double>(_size), _size);
        }